

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explore_eval.cc
# Opt level: O0

void EXPLORE_EVAL::do_actual_learning<true>(explore_eval *data,multi_learner *base,multi_ex *ec_seq)

{
  bool bVar1;
  example *peVar2;
  reference ppeVar3;
  polyprediction *this;
  multi_ex *pmVar4;
  action_score *paVar5;
  float *pfVar6;
  size_t sVar7;
  cb_class *pcVar8;
  reference ppeVar9;
  vector<example_*,_std::allocator<example_*>_> *in_RDX;
  undefined8 *in_RDI;
  float fVar10;
  float fVar11;
  cb_class cVar12;
  example **ec_1;
  iterator __end5;
  iterator __begin5;
  multi_ex *__range5;
  float inv_threshold;
  example **ec;
  iterator __end4;
  iterator __begin4;
  multi_ex *__range4;
  example *ec_found;
  float threshold;
  size_t i;
  float action_probability;
  action_scores *a_s;
  example *label_example;
  multi_ex *in_stack_000004a0;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_90 [2];
  float local_7c;
  reference local_78;
  example **local_70;
  __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_> local_68 [2];
  undefined8 in_stack_ffffffffffffffa8;
  uint32_t id;
  float in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  multi_ex *in_stack_ffffffffffffffb8;
  multi_ex *pmVar13;
  multi_ex *examples;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  float fVar14;
  undefined8 local_30;
  undefined8 local_28;
  
  id = (uint32_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  peVar2 = CB_EXPLORE_ADF::test_adf_sequence(in_stack_000004a0);
  if (peVar2 != (example *)0x0) {
    *(label_t *)(in_RDI + 4) = (peVar2->l).multi;
    in_RDI[5] = (peVar2->l).cs.costs._end;
    in_RDI[6] = (peVar2->l).cs.costs.end_array;
    in_RDI[7] = (peVar2->l).cs.costs.erase_count;
    (peVar2->l).multi = *(label_t *)(in_RDI + 8);
    (peVar2->l).cs.costs._end = (wclass *)in_RDI[9];
    (peVar2->l).cs.costs.end_array = (wclass *)in_RDI[10];
    (peVar2->l).cs.costs.erase_count = in_RDI[0xb];
  }
  LEARNER::multiline_learn_or_predict<false>
            ((multi_learner *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             in_stack_ffffffffffffffb8,CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)
             ,id);
  if (peVar2 != (example *)0x0) {
    (peVar2->l).multi = *(label_t *)(in_RDI + 4);
    (peVar2->l).cs.costs._end = (wclass *)in_RDI[5];
    (peVar2->l).cs.costs.end_array = (wclass *)in_RDI[6];
    (peVar2->l).cs.costs.erase_count = in_RDI[7];
  }
  cVar12 = CB_ADF::get_observed_cost
                     ((multi_ex *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_30 = cVar12._0_8_;
  *in_RDI = local_30;
  local_28 = cVar12._8_8_;
  in_RDI[1] = local_28;
  if (peVar2 != (example *)0x0) {
    ppeVar3 = std::vector<example_*,_std::allocator<example_*>_>::operator[](in_RDX,0);
    this = &(*ppeVar3)->pred;
    fVar14 = 0.0;
    pmVar13 = (multi_ex *)0x0;
    while (examples = pmVar13,
          pmVar4 = (multi_ex *)
                   v_array<ACTION_SCORE::action_score>::size
                             ((v_array<ACTION_SCORE::action_score> *)&this->scalars),
          pmVar13 < pmVar4) {
      in_stack_ffffffffffffff54 = *(uint32_t *)((long)in_RDI + 4);
      paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                         ((v_array<ACTION_SCORE::action_score> *)&this->scalars,(size_t)examples);
      if (in_stack_ffffffffffffff54 == paVar5->action) {
        paVar5 = v_array<ACTION_SCORE::action_score>::operator[]
                           ((v_array<ACTION_SCORE::action_score> *)&this->scalars,(size_t)examples);
        fVar14 = paVar5->score;
      }
      pmVar13 = (multi_ex *)
                ((long)&(examples->super__Vector_base<example_*,_std::allocator<example_*>_>).
                        _M_impl.super__Vector_impl_data._M_start + 1);
    }
    fVar10 = fVar14 / *(float *)(in_RDI + 1);
    if ((*(byte *)((long)in_RDI + 0x7c) & 1) == 0) {
      in_stack_ffffffffffffffb0 = 1.0 / fVar10;
      pfVar6 = std::min<float>((float *)(in_RDI + 0xf),(float *)&stack0xffffffffffffffb0);
      *(float *)(in_RDI + 0xf) = *pfVar6;
    }
    else {
      fVar10 = *(float *)(in_RDI + 0xf) * fVar10;
    }
    if (1.000001 < fVar10) {
      in_RDI[0xe] = in_RDI[0xe] + 1;
    }
    fVar11 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    if (fVar11 < fVar10) {
      peVar2 = (example *)0x0;
      local_68[0]._M_current =
           (example **)
           std::vector<example_*,_std::allocator<example_*>_>::begin
                     ((vector<example_*,_std::allocator<example_*>_> *)
                      CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      local_70 = (example **)
                 std::vector<example_*,_std::allocator<example_*>_>::end
                           ((vector<example_*,_std::allocator<example_*>_> *)
                            CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                                (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
            bVar1) {
        local_78 = __gnu_cxx::
                   __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                   ::operator*(local_68);
        sVar7 = v_array<CB::cb_class>::size((v_array<CB::cb_class> *)&((*local_78)->l).simple);
        if (sVar7 == 1) {
          pcVar8 = v_array<CB::cb_class>::operator[]
                             ((v_array<CB::cb_class> *)&((*local_78)->l).simple,0);
          if (((pcVar8->cost != 3.4028235e+38) || (NAN(pcVar8->cost))) &&
             (pcVar8 = v_array<CB::cb_class>::operator[]
                                 ((v_array<CB::cb_class> *)&((*local_78)->l).simple,0),
             0.0 < pcVar8->probability)) {
            peVar2 = *local_78;
          }
        }
        if (1.0 < fVar10) {
          (*local_78)->weight = fVar10 * (*local_78)->weight;
        }
        __gnu_cxx::
        __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
        operator++(local_68);
      }
      fVar11 = fVar14;
      pcVar8 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(peVar2->l).simple,0);
      pcVar8->probability = fVar14;
      LEARNER::multiline_learn_or_predict<true>
                ((multi_learner *)CONCAT44(fVar11,in_stack_ffffffffffffffc0),examples,
                 CONCAT44(fVar10,in_stack_ffffffffffffffb0),(uint32_t)((ulong)peVar2 >> 0x20));
      if (1.0 < fVar10) {
        local_7c = 1.0 / fVar10;
        local_90[0]._M_current =
             (example **)
             std::vector<example_*,_std::allocator<example_*>_>::begin
                       ((vector<example_*,_std::allocator<example_*>_> *)
                        CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        std::vector<example_*,_std::allocator<example_*>_>::end
                  ((vector<example_*,_std::allocator<example_*>_> *)
                   CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff54,fVar14),
                                  (__normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                                   *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
              bVar1) {
          ppeVar9 = __gnu_cxx::
                    __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>
                    ::operator*(local_90);
          (*ppeVar9)->weight = local_7c * (*ppeVar9)->weight;
          __gnu_cxx::
          __normal_iterator<example_**,_std::vector<example_*,_std::allocator<example_*>_>_>::
          operator++(local_90);
        }
      }
      fVar14 = *(float *)(in_RDI + 1);
      pcVar8 = v_array<CB::cb_class>::operator[]((v_array<CB::cb_class> *)&(peVar2->l).simple,0);
      pcVar8->probability = fVar14;
      in_RDI[0xd] = in_RDI[0xd] + 1;
    }
  }
  return;
}

Assistant:

void do_actual_learning(explore_eval& data, multi_learner& base, multi_ex& ec_seq)
{
  example* label_example = CB_EXPLORE_ADF::test_adf_sequence(ec_seq);

  if (label_example != nullptr)  // extract label
  {
    data.action_label = label_example->l.cb;
    label_example->l.cb = data.empty_label;
  }
  multiline_learn_or_predict<false>(base, ec_seq, data.offset);

  if (label_example != nullptr)  // restore label
    label_example->l.cb = data.action_label;

  data.known_cost = CB_ADF::get_observed_cost(ec_seq);
  if (label_example != nullptr && is_learn)
  {
    ACTION_SCORE::action_scores& a_s = ec_seq[0]->pred.a_s;

    float action_probability = 0;
    for (size_t i = 0; i < a_s.size(); i++)
      if (data.known_cost.action == a_s[i].action)
        action_probability = a_s[i].score;

    float threshold = action_probability / data.known_cost.probability;

    if (!data.fixed_multiplier)
      data.multiplier = min(data.multiplier, 1 / threshold);
    else
      threshold *= data.multiplier;

    if (threshold > 1. + 1e-6)
      data.violations++;

    if (merand48(data.all->random_state) < threshold)
    {
      example* ec_found = nullptr;
      for (example*& ec : ec_seq)
      {
        if (ec->l.cb.costs.size() == 1 && ec->l.cb.costs[0].cost != FLT_MAX && ec->l.cb.costs[0].probability > 0)
          ec_found = ec;
        if (threshold > 1)
          ec->weight *= threshold;
      }
      ec_found->l.cb.costs[0].probability = action_probability;

      multiline_learn_or_predict<true>(base, ec_seq, data.offset);

      if (threshold > 1)
      {
        float inv_threshold = 1.f / threshold;
        for (auto& ec : ec_seq) ec->weight *= inv_threshold;
      }
      ec_found->l.cb.costs[0].probability = data.known_cost.probability;
      data.update_count++;
    }
  }
}